

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_exec(sqlite3 *db,char *zSql,sqlite3_callback xCallback,void *pArg,char **pzErrMsg)

{
  byte *pbVar1;
  bool bVar2;
  Vdbe *pVVar3;
  int iVar4;
  Vdbe *pVm;
  char **p;
  char *pcVar5;
  uchar *puVar6;
  Mem *pMVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  char **ppcVar11;
  sqlite3_stmt *pStmt;
  char *zLeftover;
  int local_6c;
  Vdbe *local_68;
  uint local_5c;
  char **local_58;
  sqlite3 *local_50;
  char *local_48;
  sqlite3_callback local_40;
  void *local_38;
  
  local_68 = (Vdbe *)0x0;
  local_40 = xCallback;
  local_38 = pArg;
  iVar4 = sqlite3SafetyCheckOk(db);
  if (iVar4 == 0) {
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x21478,
                "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33");
    return 0x15;
  }
  pcVar5 = "";
  if (zSql != (char *)0x0) {
    pcVar5 = zSql;
  }
  local_58 = pzErrMsg;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  db->errCode = 0;
  local_50 = db;
  if (db->pErr == (sqlite3_value *)0x0) {
    db->errByteOffset = -1;
  }
  else {
    sqlite3ErrorFinish(db,0);
  }
  while( true ) {
    if (*pcVar5 == '\0') break;
    local_68 = (Vdbe *)0x0;
    local_6c = sqlite3LockAndPrepare
                         (db,pcVar5,-1,0x80,(Vdbe *)0x0,(sqlite3_stmt **)&local_68,&local_48);
    if (local_6c != 0) goto LAB_0011acca;
    if (local_68 == (Vdbe *)0x0) {
      local_6c = 0;
      pcVar5 = local_48;
    }
    else {
      p = (char **)0x0;
      bVar2 = false;
      local_5c = 0;
      ppcVar11 = (char **)0x0;
      do {
        local_6c = sqlite3_step((sqlite3_stmt *)local_68);
        if (local_40 != (sqlite3_callback)0x0) {
          if (local_6c == 100) {
            if (!bVar2) goto LAB_0011ab07;
LAB_0011ab74:
            uVar10 = (ulong)local_5c;
            ppcVar11 = p + uVar10;
            if ((int)local_5c < 1) {
              uVar10 = 0;
            }
            else {
              uVar9 = 0;
              do {
                puVar6 = sqlite3_column_text((sqlite3_stmt *)local_68,(int)uVar9);
                pVVar3 = local_68;
                ppcVar11[uVar9] = (char *)puVar6;
                if (puVar6 == (uchar *)0x0) {
                  pMVar7 = columnMem((sqlite3_stmt *)local_68,(int)uVar9);
                  uVar8._0_2_ = pMVar7->flags;
                  uVar8._2_1_ = pMVar7->enc;
                  uVar8._3_1_ = pMVar7->eSubtype;
                  columnMallocFailure((sqlite3_stmt *)pVVar3);
                  db = local_50;
                  if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar8 & 0x3f) & 1) == 0) {
                    sqlite3OomFault(local_50);
                    local_6c = 100;
                    goto LAB_0011acd2;
                  }
                }
                uVar9 = uVar9 + 1;
              } while (uVar10 != uVar9);
            }
            ppcVar11[uVar10] = (char *)0x0;
          }
          else {
            if (((local_6c != 0x65) || (bVar2)) || ((db->flags & 0x100) == 0)) break;
LAB_0011ab07:
            if (local_68 == (Vdbe *)0x0) {
              uVar8 = 0;
            }
            else {
              uVar8 = (uint)local_68->nResColumn;
            }
            p = (char **)sqlite3DbMallocRawNN(db,(ulong)(uVar8 << 4 | 8));
            pVVar3 = local_68;
            if (p == (char **)0x0) goto LAB_0011acca;
            local_5c = uVar8;
            if (uVar8 != 0) {
              uVar10 = 0;
              do {
                pcVar5 = (char *)columnName((sqlite3_stmt *)pVVar3,(int)uVar10,0,0);
                p[uVar10] = pcVar5;
                uVar10 = uVar10 + 1;
              } while (uVar8 != uVar10);
            }
            if (local_6c == 100) goto LAB_0011ab74;
          }
          db = local_50;
          iVar4 = (*local_40)(local_38,local_5c,ppcVar11,p);
          bVar2 = true;
          if (iVar4 != 0) {
            sqlite3VdbeFinalize(local_68);
            local_68 = (Vdbe *)0x0;
            db->errCode = 4;
            local_6c = 4;
            sqlite3ErrorFinish(db,4);
            goto LAB_0011acd2;
          }
        }
      } while (local_6c == 100);
      local_6c = sqlite3VdbeFinalize(local_68);
      local_68 = (Vdbe *)0x0;
      pcVar5 = local_48 + -1;
      do {
        pbVar1 = (byte *)(pcVar5 + 1);
        pcVar5 = pcVar5 + 1;
      } while ((""[*pbVar1] & 1) != 0);
      if (p != (char **)0x0) {
        sqlite3DbFreeNN(db,p);
      }
    }
    if (local_6c != 0) goto LAB_0011acca;
  }
  local_6c = 0;
LAB_0011acca:
  p = (char **)0x0;
LAB_0011acd2:
  ppcVar11 = local_58;
  if (local_68 != (Vdbe *)0x0) {
    sqlite3VdbeFinalize(local_68);
  }
  if (p != (char **)0x0) {
    sqlite3DbFreeNN(db,p);
  }
  if ((local_6c == 0) && (db->mallocFailed == '\0')) {
    iVar4 = 0;
  }
  else {
    iVar4 = apiHandleError(db,local_6c);
    if ((ppcVar11 != (char **)0x0) && (iVar4 != 0)) {
      pcVar5 = sqlite3_errmsg(db);
      pcVar5 = sqlite3DbStrDup((sqlite3 *)0x0,pcVar5);
      *ppcVar11 = pcVar5;
      if (pcVar5 == (char *)0x0) {
        db->errCode = 7;
        iVar4 = 7;
        sqlite3ErrorFinish(db,7);
      }
      goto LAB_0011ad57;
    }
  }
  if (ppcVar11 != (char **)0x0) {
    *ppcVar11 = (char *)0x0;
  }
LAB_0011ad57:
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar4;
}

Assistant:

SQLITE_API int sqlite3_exec(
  sqlite3 *db,                /* The database on which the SQL executes */
  const char *zSql,           /* The SQL to be executed */
  sqlite3_callback xCallback, /* Invoke this callback routine */
  void *pArg,                 /* First argument to xCallback() */
  char **pzErrMsg             /* Write error messages here */
){
  int rc = SQLITE_OK;         /* Return code */
  const char *zLeftover;      /* Tail of unprocessed SQL */
  sqlite3_stmt *pStmt = 0;    /* The current SQL statement */
  char **azCols = 0;          /* Names of result columns */
  int callbackIsInit;         /* True if callback data is initialized */

  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
  if( zSql==0 ) zSql = "";

  sqlite3_mutex_enter(db->mutex);
  sqlite3Error(db, SQLITE_OK);
  while( rc==SQLITE_OK && zSql[0] ){
    int nCol = 0;
    char **azVals = 0;

    pStmt = 0;
    rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, &zLeftover);
    assert( rc==SQLITE_OK || pStmt==0 );
    if( rc!=SQLITE_OK ){
      continue;
    }
    if( !pStmt ){
      /* this happens for a comment or white-space */
      zSql = zLeftover;
      continue;
    }
    callbackIsInit = 0;

    while( 1 ){
      int i;
      rc = sqlite3_step(pStmt);

      /* Invoke the callback function if required */
      if( xCallback && (SQLITE_ROW==rc ||
          (SQLITE_DONE==rc && !callbackIsInit
                           && db->flags&SQLITE_NullCallback)) ){
        if( !callbackIsInit ){
          nCol = sqlite3_column_count(pStmt);
          azCols = sqlite3DbMallocRaw(db, (2*nCol+1)*sizeof(const char*));
          if( azCols==0 ){
            goto exec_out;
          }
          for(i=0; i<nCol; i++){
            azCols[i] = (char *)sqlite3_column_name(pStmt, i);
            /* sqlite3VdbeSetColName() installs column names as UTF8
            ** strings so there is no way for sqlite3_column_name() to fail. */
            assert( azCols[i]!=0 );
          }
          callbackIsInit = 1;
        }
        if( rc==SQLITE_ROW ){
          azVals = &azCols[nCol];
          for(i=0; i<nCol; i++){
            azVals[i] = (char *)sqlite3_column_text(pStmt, i);
            if( !azVals[i] && sqlite3_column_type(pStmt, i)!=SQLITE_NULL ){
              sqlite3OomFault(db);
              goto exec_out;
            }
          }
          azVals[i] = 0;
        }
        if( xCallback(pArg, nCol, azVals, azCols) ){
          /* EVIDENCE-OF: R-38229-40159 If the callback function to
          ** sqlite3_exec() returns non-zero, then sqlite3_exec() will
          ** return SQLITE_ABORT. */
          rc = SQLITE_ABORT;
          sqlite3VdbeFinalize((Vdbe *)pStmt);
          pStmt = 0;
          sqlite3Error(db, SQLITE_ABORT);
          goto exec_out;
        }
      }

      if( rc!=SQLITE_ROW ){
        rc = sqlite3VdbeFinalize((Vdbe *)pStmt);
        pStmt = 0;
        zSql = zLeftover;
        while( sqlite3Isspace(zSql[0]) ) zSql++;
        break;
      }
    }

    sqlite3DbFree(db, azCols);
    azCols = 0;
  }

exec_out:
  if( pStmt ) sqlite3VdbeFinalize((Vdbe *)pStmt);
  sqlite3DbFree(db, azCols);

  rc = sqlite3ApiExit(db, rc);
  if( rc!=SQLITE_OK && pzErrMsg ){
    *pzErrMsg = sqlite3DbStrDup(0, sqlite3_errmsg(db));
    if( *pzErrMsg==0 ){
      rc = SQLITE_NOMEM_BKPT;
      sqlite3Error(db, SQLITE_NOMEM);
    }
  }else if( pzErrMsg ){
    *pzErrMsg = 0;
  }

  assert( (rc&db->errMask)==rc );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}